

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void open_func(LexState *ls,FuncState *fs)

{
  lua_State *L;
  global_State *pgVar1;
  StkId pTVar2;
  GCObject *pGVar3;
  GCObject *pGVar4;
  
  L = ls->L;
  pGVar3 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x78);
  pgVar1 = L->l_G;
  (pGVar3->gch).next = pgVar1->rootgc;
  pgVar1->rootgc = pGVar3;
  (pGVar3->gch).marked = pgVar1->currentwhite & 3;
  (pGVar3->gch).tt = '\t';
  *(int *)((long)pGVar3 + 0x60) = 0;
  *(int *)((long)pGVar3 + 100) = 0;
  (pGVar3->th).base_ci = (CallInfo *)0x0;
  *(int *)((long)pGVar3 + 0x58) = 0;
  *(int *)((long)pGVar3 + 0x5c) = 0;
  (pGVar3->p).source = (TString *)0x0;
  (pGVar3->th).end_ci = (CallInfo *)0x0;
  (pGVar3->h).gclist = (GCObject *)0x0;
  (pGVar3->p).upvalues = (TString **)0x0;
  (pGVar3->h).node = (Node *)0x0;
  (pGVar3->h).lastfree = (Node *)0x0;
  (pGVar3->h).metatable = (Table *)0x0;
  (pGVar3->h).array = (TValue *)0x0;
  *(lu_byte *)((long)pGVar3 + 0x70) = '\0';
  *(lu_byte *)((long)pGVar3 + 0x71) = '\0';
  *(lu_byte *)((long)pGVar3 + 0x72) = '\0';
  *(lu_byte *)((long)pGVar3 + 0x73) = '\0';
  fs->f = (Proto *)pGVar3;
  fs->prev = ls->fs;
  fs->ls = ls;
  fs->L = L;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = -1;
  fs->jpc = -1;
  fs->bl = (BlockCnt *)0x0;
  fs->freereg = 0;
  fs->nk = 0;
  *(undefined8 *)((long)&fs->nk + 3) = 0;
  (pGVar3->p).source = ls->source;
  (pGVar3->p).maxstacksize = '\x02';
  pGVar4 = (GCObject *)luaH_new(L,0,0);
  fs->h = (Table *)pGVar4;
  pTVar2 = L->top;
  (pTVar2->value).gc = pGVar4;
  pTVar2->tt = 5;
  if ((long)L->stack_last - (long)L->top < 0x11) {
    luaD_growstack(L,1);
  }
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  pTVar2[1].value.p = pGVar3;
  pTVar2[1].tt = 9;
  if ((long)L->stack_last - (long)L->top < 0x11) {
    luaD_growstack(L,1);
  }
  L->top = L->top + 1;
  return;
}

Assistant:

static void open_func(LexState*ls,FuncState*fs){
lua_State*L=ls->L;
Proto*f=luaF_newproto(L);
fs->f=f;
fs->prev=ls->fs;
fs->ls=ls;
fs->L=L;
ls->fs=fs;
fs->pc=0;
fs->lasttarget=-1;
fs->jpc=(-1);
fs->freereg=0;
fs->nk=0;
fs->np=0;
fs->nlocvars=0;
fs->nactvar=0;
fs->bl=NULL;
f->source=ls->source;
f->maxstacksize=2;
fs->h=luaH_new(L,0,0);
sethvalue(L,L->top,fs->h);
incr_top(L);
setptvalue(L,L->top,f);
incr_top(L);
}